

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_utils.cc
# Opt level: O0

timespec convert_reltime_to_abstime(uint ms)

{
  timespec tVar1;
  uint in_EDI;
  uint64_t wakeup;
  timeval tp;
  timespec ts;
  ulong local_30;
  timeval local_28;
  uint local_14;
  undefined1 local_10 [16];
  
  local_14 = in_EDI;
  memset(local_10,0,0x10);
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  local_30 = local_28.tv_sec * 1000 + local_28.tv_usec / 1000 + (ulong)local_14;
  if (499 < local_28.tv_usec % 1000) {
    local_30 = local_30 + 1;
  }
  tVar1.tv_nsec = (local_30 % 1000) * 1000000;
  tVar1.tv_sec = local_30 / 1000;
  return tVar1;
}

Assistant:

struct timespec convert_reltime_to_abstime(unsigned int ms) {
    struct timespec ts;
    struct timeval tp;
    uint64_t wakeup;

    memset(&ts, 0, sizeof(ts));

    /*
     * Unfortunately pthread_cond_timedwait doesn't support relative sleeps
     * so we need to convert back to an absolute time.
     */
    gettimeofday(&tp, NULL);
    wakeup = ((uint64_t)(tp.tv_sec) * 1000) + (tp.tv_usec / 1000) + ms;
    /* Round up for sub ms */
    if ((tp.tv_usec % 1000) > 499) {
        ++wakeup;
    }

    ts.tv_sec = wakeup / 1000;
    wakeup %= 1000;
    ts.tv_nsec = wakeup * 1000000;
    return ts;
}